

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.cpp
# Opt level: O0

OLECHAR * Js::CharClassifier::SkipWhiteSpaceSurrogateStartEnd
                    (LPCOLESTR pStr,LPCOLESTR pStrEnd,CharClassifier *instance)

{
  codepoint_t ch;
  bool bVar1;
  OLECHAR local_2a;
  char16 currentChar;
  CharClassifier *instance_local;
  LPCOLESTR pStrEnd_local;
  LPCOLESTR pStr_local;
  
  local_2a = L'\0';
  pStrEnd_local = pStr;
  while( true ) {
    while( true ) {
      bVar1 = false;
      if (pStrEnd_local < pStrEnd) {
        local_2a = *pStrEnd_local;
        bVar1 = local_2a != L'\0';
      }
      if (!bVar1) {
        return pStrEnd_local;
      }
      bVar1 = IsWhiteSpace(instance,(uint)(ushort)local_2a);
      if (!bVar1) break;
      pStrEnd_local = pStrEnd_local + 1;
    }
    bVar1 = NumberUtilities::IsSurrogateLowerPart((uint)(ushort)local_2a);
    if (!bVar1) {
      return pStrEnd_local;
    }
    if (pStrEnd <= pStrEnd_local + 1) break;
    bVar1 = NumberUtilities::IsSurrogateUpperPart((uint)(ushort)pStrEnd_local[1]);
    if (!bVar1) {
      return pStrEnd_local;
    }
    ch = NumberUtilities::SurrogatePairAsCodePoint
                   ((uint)(ushort)local_2a,(uint)(ushort)pStrEnd_local[1]);
    bVar1 = IsWhiteSpace(instance,ch);
    if (!bVar1) {
      return pStrEnd_local;
    }
    pStrEnd_local = pStrEnd_local + 2;
  }
  return pStrEnd_local;
}

Assistant:

const OLECHAR* Js::CharClassifier::SkipWhiteSpaceSurrogateStartEnd(_In_reads_(pStrEnd - pStr) LPCOLESTR pStr, _In_ LPCOLESTR pStrEnd, const CharClassifier *instance)
{
    char16 currentChar = 0x0;

    // Same reasoning as above
    while(pStr < pStrEnd && (currentChar = *pStr) != '\0')
    {
        if (!instance->IsWhiteSpace(currentChar))
        {
            if (Js::NumberUtilities::IsSurrogateLowerPart(currentChar) && (pStr + 1) < pStrEnd && Js::NumberUtilities::IsSurrogateUpperPart(*(pStr + 1)))
            {
                if (instance->IsWhiteSpace(Js::NumberUtilities::SurrogatePairAsCodePoint(currentChar, *(pStr + 1))))
                {
                    pStr += 2;
                    continue;
                }
            }

            // Above case failed, so we have reached the last whitespace
            return pStr;
        }

        pStr++;
    }

    return pStr;
}